

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

Approx * __thiscall
doctest::Approx::operator()(Approx *__return_storage_ptr__,Approx *this,double value)

{
  Approx *approx;
  double value_local;
  Approx *this_local;
  
  Approx(__return_storage_ptr__,value);
  epsilon(__return_storage_ptr__,this->m_epsilon);
  scale(__return_storage_ptr__,this->m_scale);
  return __return_storage_ptr__;
}

Assistant:

Approx Approx::operator()(double value) const {
    Approx approx(value);
    approx.epsilon(m_epsilon);
    approx.scale(m_scale);
    return approx;
}